

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::GetBrDropKeepCount
          (BinaryReaderInterp *this,Index depth,Index *out_drop_count,Index *out_keep_count)

{
  Result RVar1;
  Enum EVar2;
  uint uVar3;
  Index IVar4;
  ulong uVar5;
  uint uVar6;
  TypeVector *pTVar7;
  Label *label;
  Label *local_20;
  
  RVar1 = TypeChecker::GetLabel(&(this->validator_).typechecker_,depth,&local_20);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    uVar5 = (long)(this->validator_).typechecker_.type_stack_.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->validator_).typechecker_.type_stack_.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    if (uVar5 < local_20->type_stack_limit) {
      __assert_fail("validator_.type_stack_size() >= type_stack_limit",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x19b,
                    "Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::GetDropCount(Index, size_t, Index *)"
                   );
    }
    pTVar7 = &local_20->result_types;
    if (local_20->label_type == Loop) {
      pTVar7 = &local_20->param_types;
    }
    uVar3 = (int)uVar5 - (int)local_20->type_stack_limit;
    EVar2 = Ok;
    uVar6 = (uint)((ulong)((long)(pTVar7->
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(pTVar7->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3);
    IVar4 = uVar3 - uVar6;
    if (uVar3 < uVar6) {
      IVar4 = 0;
    }
    *out_drop_count = IVar4;
    *out_keep_count = uVar6;
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::GetBrDropKeepCount(Index depth,
                                              Index* out_drop_count,
                                              Index* out_keep_count) {
  SharedValidator::Label* label;
  CHECK_RESULT(validator_.GetLabel(depth, &label));
  Index keep_count = label->br_types().size();
  CHECK_RESULT(
      GetDropCount(keep_count, label->type_stack_limit, out_drop_count));
  *out_keep_count = keep_count;
  return Result::Ok;
}